

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O2

DecodeStatus DecodePCRelLabel19(MCInst *Inst,uint Imm,uint64_t Addr,void *Decoder)

{
  DecodeStatus extraout_EAX;
  ulong Val;
  
  Val = (ulong)Imm | 0xfffffffffff80000;
  if ((Imm >> 0x12 & 1) == 0) {
    Val = (ulong)Imm;
  }
  MCOperand_CreateImm0(Inst,Val);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodePCRelLabel19(MCInst *Inst, unsigned Imm,
		uint64_t Addr, const void *Decoder)
{
	int64_t ImmVal = Imm;

	// Sign-extend 19-bit immediate.
	if (ImmVal & (1 << (19 - 1)))
		ImmVal |= ~((1LL << 19) - 1);

	MCOperand_CreateImm0(Inst, ImmVal);
	return Success;
}